

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::uploadImage
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkImage image,VkImageLayout layout,
          TextureLevelPyramid *data)

{
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  RefData<vk::Handle<(vk::HandleType)6>_> data_03;
  deUint32 dstLen;
  VkResult VVar3;
  Handle<(vk::HandleType)8> *pHVar4;
  Handle<(vk::HandleType)24> *pHVar5;
  Allocation *pAVar6;
  void *dst;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  VkCommandBuffer_s **ppVVar7;
  size_type sVar8;
  reference pvVar9;
  Handle<(vk::HandleType)6> *pHVar10;
  bool bVar11;
  deUint32 local_3ec;
  undefined8 uStack_3d8;
  VkSubmitInfo submitInfo;
  undefined1 local_370 [8];
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copySlices;
  deUint64 infiniteTimeout;
  RefData<vk::Handle<(vk::HandleType)6>_> local_330;
  undefined1 local_310 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> cmdCompleteFence;
  Move<vk::VkCommandBuffer_s_*> local_2e8;
  RefData<vk::VkCommandBuffer_s_*> local_2c8;
  undefined1 local_2a8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmd;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  RefData<vk::Handle<(vk::HandleType)24>_> local_248;
  undefined1 local_228 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  VkImageMemoryBarrier postImageBarrier;
  VkImageMemoryBarrier preImageBarrier;
  VkImageSubresourceRange fullSubrange;
  VkBufferMemoryBarrier preMemoryBarrier;
  undefined1 local_100 [8];
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> dataBufferMemory;
  Move<vk::Handle<(vk::HandleType)8>_> local_e0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_c0;
  undefined1 local_a0 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> dataBuffer;
  VkBufferCreateInfo bufferCreateInfo;
  deUint32 dataBufferSize;
  deUint32 arraySize;
  Allocator *allocator_local;
  VkQueue queue_local;
  deUint32 queueFamilyIndex_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  ImageInstanceImages *this_local;
  VkImage image_local;
  
  if (this->m_viewType == VK_IMAGE_VIEW_TYPE_3D) {
    local_3ec = 1;
  }
  else {
    bVar11 = true;
    if (this->m_viewType != VK_IMAGE_VIEW_TYPE_CUBE) {
      bVar11 = this->m_viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY;
    }
    local_3ec = 2;
    if (bVar11) {
      local_3ec = 0xc;
    }
  }
  dstLen = getTextureLevelPyramidDataSize(data);
  dataBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ = 0xc;
  ::vk::createBuffer(&local_e0,vki,device,
                     (VkBufferCreateInfo *)
                     &dataBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c0,(Move *)&local_e0);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_c0.deleter.m_deviceIface;
  data_00.object.m_internal = local_c0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_c0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_c0.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_c0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_a0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_e0);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a0);
  allocateAndBindObjectMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_100,vki,device,
             allocator,(VkBuffer)pHVar4->m_internal,::vk::MemoryRequirement::HostVisible);
  fullSubrange.baseArrayLayer = 0x2c;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a0);
  fullSubrange.aspectMask = tcu::TextureLevelPyramid::getNumLevels(data);
  fullSubrange.baseMipLevel = 0;
  fullSubrange.levelCount = local_3ec;
  postImageBarrier.subresourceRange.layerCount = 0x2d;
  cmdPoolCreateInfo.flags = 0x2d;
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext._0_4_ = 0x1000;
  postImageBarrier.pNext._4_4_ = 0x20;
  postImageBarrier.srcAccessMask = 7;
  postImageBarrier.dstAccessMask = layout;
  postImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  postImageBarrier._32_8_ = image.m_internal;
  postImageBarrier.subresourceRange.levelCount = local_3ec;
  postImageBarrier.image.m_internal = 1;
  postImageBarrier.subresourceRange._0_8_ = ZEXT48(fullSubrange.aspectMask);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  cmdPoolCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdPoolCreateInfo._4_4_ = 0;
  cmdPoolCreateInfo.pNext._0_4_ = 1;
  cmdPoolCreateInfo.pNext._4_4_ = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufBeginInfo.pInheritanceInfo,vki,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_248,(Move *)&cmdBufBeginInfo.pInheritanceInfo);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_248.deleter.m_deviceIface;
  data_01.object.m_internal = local_248.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_248.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_248.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_248.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_248.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_228,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufBeginInfo.pInheritanceInfo);
  cmdBufBeginInfo.pNext = (void *)0x1;
  cmdBufBeginInfo.flags = 0;
  cmdBufBeginInfo._20_4_ = 0;
  cmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0x2a;
  cmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufBeginInfo._4_4_ = 0;
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_228);
  cmdCompleteFence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar5->m_internal;
  ::vk::allocateCommandBuffer
            (&local_2e8,vki,device,
             (VkCommandPool)
             cmdCompleteFence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
             m_allocator,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2c8,(Move *)&local_2e8);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_2c8.deleter.m_deviceIface;
  data_02.object = local_2c8.object;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2c8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_2c8.deleter.m_device;
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_2c8.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_2c8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_2a8,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_2e8);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&infiniteTimeout,vki,device,0,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_330,(Move *)&infiniteTimeout);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_330.deleter.m_deviceIface;
  data_03.object.m_internal = local_330.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_330.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_330.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_330.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_330.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_310,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&infiniteTimeout);
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)local_370);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_100);
  dst = ::vk::Allocation::getHostPtr(pAVar6);
  writeTextureLevelPyramidData
            (dst,dstLen,data,this->m_viewType,
             (vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)local_370);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_100);
  memory = ::vk::Allocation::getMemory(pAVar6);
  pAVar6 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_100);
  offset = ::vk::Allocation::getOffset(pAVar6);
  ::vk::flushMappedMemoryRange(vki,device,memory,offset,(ulong)dstLen);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  VVar3 = (*vki->_vptr_DeviceInterface[0x49])
                    (vki,*ppVVar7,&cmd.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool)
  ;
  ::vk::checkResult(VVar3,"vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe2b);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  (*vki->_vptr_DeviceInterface[0x6d])
            (vki,*ppVVar7,1,0x1000,0,0,0,1,&fullSubrange.baseArrayLayer,1,
             &postImageBarrier.subresourceRange.layerCount);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  pVVar1 = *ppVVar7;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_a0);
  dVar2 = pHVar4->m_internal;
  sVar8 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::size
                    ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                     local_370);
  pvVar9 = std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::operator[]
                     ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)
                      local_370,0);
  (*vki->_vptr_DeviceInterface[0x62])(vki,pVVar1,dVar2,image.m_internal,7,sVar8 & 0xffffffff,pvVar9)
  ;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  (*vki->_vptr_DeviceInterface[0x6d])(vki,*ppVVar7,0x1000,1,0,0,0,0,0,1,&cmdPoolCreateInfo.flags);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  VVar3 = (*vki->_vptr_DeviceInterface[0x4a])(vki,*ppVVar7);
  ::vk::checkResult(VVar3,"vki.endCommandBuffer(*cmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe35);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_3d8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_2a8);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_310);
  VVar3 = (*vki->_vptr_DeviceInterface[2])(vki,queue,1,&uStack_3d8,pHVar10->m_internal);
  ::vk::checkResult(VVar3,"vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe45);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_310);
  VVar3 = (*vki->_vptr_DeviceInterface[0x16])(vki,device,1,pHVar10,0,0xffffffffffffffff);
  ::vk::checkResult(VVar3,
                    "vki.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe47);
  std::vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>::~vector
            ((vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> *)local_370);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_310);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_2a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_228);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_100);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_a0);
  return;
}

Assistant:

void ImageInstanceImages::uploadImage (const vk::DeviceInterface&		vki,
									   vk::VkDevice						device,
									   deUint32							queueFamilyIndex,
									   vk::VkQueue						queue,
									   vk::Allocator&					allocator,
									   vk::VkImage						image,
									   vk::VkImageLayout				layout,
									   const tcu::TextureLevelPyramid&	data)
{
	const deUint32						arraySize					= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D) ? (1) :
																	  (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) ? (6 * (deUint32)ARRAY_SIZE) :
																	  ((deUint32)ARRAY_SIZE);
	const deUint32						dataBufferSize				= getTextureLevelPyramidDataSize(data);
	const vk::VkBufferCreateInfo		bufferCreateInfo			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,
		0u,													// flags
		dataBufferSize,										// size
		vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT,				// usage
		vk::VK_SHARING_MODE_EXCLUSIVE,						// sharingMode
		0u,													// queueFamilyCount
		DE_NULL,											// pQueueFamilyIndices
	};
	const vk::Unique<vk::VkBuffer>		dataBuffer					(vk::createBuffer(vki, device, &bufferCreateInfo));
	const de::MovePtr<vk::Allocation>	dataBufferMemory			= allocateAndBindObjectMemory(vki, device, allocator, *dataBuffer, vk::MemoryRequirement::HostVisible);
	const vk::VkBufferMemoryBarrier		preMemoryBarrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_HOST_WRITE_BIT,						// outputMask
		vk::VK_ACCESS_TRANSFER_READ_BIT,					// inputMask
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		*dataBuffer,										// buffer
		0u,													// offset
		dataBufferSize,										// size
	};
	const vk::VkImageSubresourceRange	fullSubrange				=
	{
		vk::VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
		0u,													// baseMipLevel
		(deUint32)data.getNumLevels(),						// mipLevels
		0u,													// baseArraySlice
		arraySize,											// arraySize
	};
	const vk::VkImageMemoryBarrier		preImageBarrier				=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		0u,													// outputMask
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// inputMask
		vk::VK_IMAGE_LAYOUT_UNDEFINED,						// oldLayout
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// newLayout
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		image,												// image
		fullSubrange										// subresourceRange
	};
	const vk::VkImageMemoryBarrier		postImageBarrier			=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// outputMask
		vk::VK_ACCESS_SHADER_READ_BIT,						// inputMask
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// oldLayout
		layout,												// newLayout
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		image,												// image
		fullSubrange										// subresourceRange
	};
	const vk::VkCommandPoolCreateInfo		cmdPoolCreateInfo			=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
		DE_NULL,
		vk::VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// flags
		queueFamilyIndex,									// queueFamilyIndex
	};
	const vk::Unique<vk::VkCommandPool>		cmdPool						(vk::createCommandPool(vki, device, &cmdPoolCreateInfo));
	const vk::VkCommandBufferBeginInfo		cmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const vk::Unique<vk::VkCommandBuffer>	cmd							(vk::allocateCommandBuffer(vki, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::Unique<vk::VkFence>			cmdCompleteFence			(vk::createFence(vki, device));
	const deUint64							infiniteTimeout				= ~(deUint64)0u;
	std::vector<vk::VkBufferImageCopy>		copySlices;

	// copy data to buffer
	writeTextureLevelPyramidData(dataBufferMemory->getHostPtr(), dataBufferSize, data, m_viewType , &copySlices);
	flushMappedMemoryRange(vki, device, dataBufferMemory->getMemory(), dataBufferMemory->getOffset(), dataBufferSize);

	// record command buffer
	VK_CHECK(vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo));
	vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
						   0, (const vk::VkMemoryBarrier*)DE_NULL,
						   1, &preMemoryBarrier,
						   1, &preImageBarrier);
	vki.cmdCopyBufferToImage(*cmd, *dataBuffer, image, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copySlices.size(), &copySlices[0]);
	vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
						   0, (const vk::VkMemoryBarrier*)DE_NULL,
						   0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
						   1, &postImageBarrier);
	VK_CHECK(vki.endCommandBuffer(*cmd));

	// submit and wait for command buffer to complete before killing it
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&cmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence));
	}
	VK_CHECK(vki.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}